

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O2

Result __thiscall
spectest::CommandRunner::ReadInvalidTextModule
          (CommandRunner *this,string_view module_filename,string *header)

{
  string_view filename;
  Result RVar1;
  string_view filename_00;
  unique_ptr<wabt::WastLexer,_std::default_delete<wabt::WastLexer>_> lexer;
  Errors errors;
  unique_ptr<wabt::LexerSourceLineFinder,_std::default_delete<wabt::LexerSourceLineFinder>_>
  line_finder;
  unique_ptr<wabt::Module,_std::default_delete<wabt::Module>_> module;
  vector<unsigned_char,_std::allocator<unsigned_char>_> file_data;
  
  file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  filename_00.size_ = (size_type)&file_data;
  filename_00.data_ = (char *)module_filename.size_;
  RVar1 = wabt::ReadFile((wabt *)module_filename.data_,filename_00,
                         (vector<unsigned_char,_std::allocator<unsigned_char>_> *)header);
  filename.size_ =
       (size_type)
       errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  filename.data_ =
       (char *)errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
               super__Vector_impl_data._M_finish;
  wabt::WastLexer::CreateBufferLexer
            (filename,errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
                      super__Vector_impl_data._M_start,
             (size_t)lexer._M_t.
                     super___uniq_ptr_impl<wabt::WastLexer,_std::default_delete<wabt::WastLexer>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_wabt::WastLexer_*,_std::default_delete<wabt::WastLexer>_>
                     .super__Head_base<0UL,_wabt::WastLexer_*,_false>._M_head_impl);
  errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (RVar1.enum_ == Ok) {
    module._M_t.super___uniq_ptr_impl<wabt::Module,_std::default_delete<wabt::Module>_>._M_t.
    super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
    super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl =
         (__uniq_ptr_data<wabt::Module,_std::default_delete<wabt::Module>,_true,_true>)
         (__uniq_ptr_impl<wabt::Module,_std::default_delete<wabt::Module>_>)0x0;
    line_finder._M_t.
    super___uniq_ptr_impl<wabt::LexerSourceLineFinder,_std::default_delete<wabt::LexerSourceLineFinder>_>
    ._M_t.
    super__Tuple_impl<0UL,_wabt::LexerSourceLineFinder_*,_std::default_delete<wabt::LexerSourceLineFinder>_>
    .super__Head_base<0UL,_wabt::LexerSourceLineFinder_*,_false>._M_head_impl._0_1_ =
         s_features.exceptions_enabled_;
    line_finder._M_t.
    super___uniq_ptr_impl<wabt::LexerSourceLineFinder,_std::default_delete<wabt::LexerSourceLineFinder>_>
    ._M_t.
    super__Tuple_impl<0UL,_wabt::LexerSourceLineFinder_*,_std::default_delete<wabt::LexerSourceLineFinder>_>
    .super__Head_base<0UL,_wabt::LexerSourceLineFinder_*,_false>._M_head_impl._1_1_ =
         s_features.mutable_globals_enabled_;
    line_finder._M_t.
    super___uniq_ptr_impl<wabt::LexerSourceLineFinder,_std::default_delete<wabt::LexerSourceLineFinder>_>
    ._M_t.
    super__Tuple_impl<0UL,_wabt::LexerSourceLineFinder_*,_std::default_delete<wabt::LexerSourceLineFinder>_>
    .super__Head_base<0UL,_wabt::LexerSourceLineFinder_*,_false>._M_head_impl._2_1_ =
         s_features.sat_float_to_int_enabled_;
    line_finder._M_t.
    super___uniq_ptr_impl<wabt::LexerSourceLineFinder,_std::default_delete<wabt::LexerSourceLineFinder>_>
    ._M_t.
    super__Tuple_impl<0UL,_wabt::LexerSourceLineFinder_*,_std::default_delete<wabt::LexerSourceLineFinder>_>
    .super__Head_base<0UL,_wabt::LexerSourceLineFinder_*,_false>._M_head_impl._3_1_ =
         s_features.sign_extension_enabled_;
    line_finder._M_t.
    super___uniq_ptr_impl<wabt::LexerSourceLineFinder,_std::default_delete<wabt::LexerSourceLineFinder>_>
    ._M_t.
    super__Tuple_impl<0UL,_wabt::LexerSourceLineFinder_*,_std::default_delete<wabt::LexerSourceLineFinder>_>
    .super__Head_base<0UL,_wabt::LexerSourceLineFinder_*,_false>._M_head_impl._4_1_ =
         s_features.simd_enabled_;
    line_finder._M_t.
    super___uniq_ptr_impl<wabt::LexerSourceLineFinder,_std::default_delete<wabt::LexerSourceLineFinder>_>
    ._M_t.
    super__Tuple_impl<0UL,_wabt::LexerSourceLineFinder_*,_std::default_delete<wabt::LexerSourceLineFinder>_>
    .super__Head_base<0UL,_wabt::LexerSourceLineFinder_*,_false>._M_head_impl._5_1_ =
         s_features.threads_enabled_;
    line_finder._M_t.
    super___uniq_ptr_impl<wabt::LexerSourceLineFinder,_std::default_delete<wabt::LexerSourceLineFinder>_>
    ._M_t.
    super__Tuple_impl<0UL,_wabt::LexerSourceLineFinder_*,_std::default_delete<wabt::LexerSourceLineFinder>_>
    .super__Head_base<0UL,_wabt::LexerSourceLineFinder_*,_false>._M_head_impl._6_1_ =
         s_features.multi_value_enabled_;
    line_finder._M_t.
    super___uniq_ptr_impl<wabt::LexerSourceLineFinder,_std::default_delete<wabt::LexerSourceLineFinder>_>
    ._M_t.
    super__Tuple_impl<0UL,_wabt::LexerSourceLineFinder_*,_std::default_delete<wabt::LexerSourceLineFinder>_>
    .super__Head_base<0UL,_wabt::LexerSourceLineFinder_*,_false>._M_head_impl._7_1_ =
         s_features.tail_call_enabled_;
    RVar1 = wabt::ParseWatModule
                      ((WastLexer *)
                       lexer._M_t.
                       super___uniq_ptr_impl<wabt::WastLexer,_std::default_delete<wabt::WastLexer>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_wabt::WastLexer_*,_std::default_delete<wabt::WastLexer>_>
                       .super__Head_base<0UL,_wabt::WastLexer_*,_false>._M_head_impl,&module,&errors
                       ,(WastParseOptions *)&line_finder);
    std::unique_ptr<wabt::Module,_std::default_delete<wabt::Module>_>::~unique_ptr(&module);
  }
  wabt::WastLexer::MakeLineFinder((WastLexer *)&line_finder);
  wabt::FormatErrorsToFile
            (&errors,Text,
             (LexerSourceLineFinder *)
             CONCAT35(line_finder._M_t.
                      super___uniq_ptr_impl<wabt::LexerSourceLineFinder,_std::default_delete<wabt::LexerSourceLineFinder>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_wabt::LexerSourceLineFinder_*,_std::default_delete<wabt::LexerSourceLineFinder>_>
                      .super__Head_base<0UL,_wabt::LexerSourceLineFinder_*,_false>._M_head_impl.
                      _5_3_,line_finder._M_t.
                            super___uniq_ptr_impl<wabt::LexerSourceLineFinder,_std::default_delete<wabt::LexerSourceLineFinder>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_wabt::LexerSourceLineFinder_*,_std::default_delete<wabt::LexerSourceLineFinder>_>
                            .super__Head_base<0UL,_wabt::LexerSourceLineFinder_*,_false>.
                            _M_head_impl._0_5_),_stdout,header,Once,0x50);
  std::unique_ptr<wabt::LexerSourceLineFinder,_std::default_delete<wabt::LexerSourceLineFinder>_>::
  ~unique_ptr(&line_finder);
  std::vector<wabt::Error,_std::allocator<wabt::Error>_>::~vector(&errors);
  std::unique_ptr<wabt::WastLexer,_std::default_delete<wabt::WastLexer>_>::~unique_ptr(&lexer);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return (Result)RVar1.enum_;
}

Assistant:

wabt::Result CommandRunner::ReadInvalidTextModule(string_view module_filename,
                                            const std::string& header) {
  std::vector<uint8_t> file_data;
  wabt::Result result = ReadFile(module_filename, &file_data);
  std::unique_ptr<WastLexer> lexer = WastLexer::CreateBufferLexer(
      module_filename, file_data.data(), file_data.size());
  Errors errors;
  if (Succeeded(result)) {
    std::unique_ptr<wabt::Module> module;
    WastParseOptions options(s_features);
    result = ParseWatModule(lexer.get(), &module, &errors, &options);
  }

  auto line_finder = lexer->MakeLineFinder();
  FormatErrorsToFile(errors, Location::Type::Text, line_finder.get(), stdout,
                     header, PrintHeader::Once);
  return result;
}